

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::NotEquals,true,true,true>
                (uhugeint_t *ldata,uhugeint_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  idx_t iVar2;
  SelectionVector *pSVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t i;
  ulong uVar10;
  
  iVar9 = 0;
  iVar7 = 0;
  for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
    uVar4 = uVar10;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)result_sel->sel_vector[uVar10];
    }
    uVar6 = uVar10;
    if (lsel->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)lsel->sel_vector[uVar10];
    }
    uVar5 = uVar10;
    if (rsel->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)rsel->sel_vector[uVar10];
    }
    bVar1 = NotEquals::Operation<duckdb::uhugeint_t>(ldata + uVar6,rdata + uVar5);
    if (bVar1) {
      iVar2 = iVar9;
      pSVar3 = true_sel;
      iVar8 = iVar7;
      iVar9 = iVar9 + 1;
    }
    else {
      iVar8 = iVar7 + 1;
      iVar2 = iVar7;
      pSVar3 = false_sel;
    }
    pSVar3->sel_vector[iVar2] = (sel_t)uVar4;
    iVar7 = iVar8;
  }
  return iVar9;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}